

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O1

int __thiscall
google::protobuf::io::FileInputStream::CopyingFileInputStream::Read
          (CopyingFileInputStream *this,void *buffer,int size)

{
  ssize_t sVar1;
  int *piVar2;
  int iVar3;
  
  if (this->is_closed_ != false) {
    Read((CopyingFileInputStream *)&stack0xffffffffffffffd0);
  }
  do {
    sVar1 = read(this->file_,buffer,(long)size);
    iVar3 = (int)sVar1;
    if (-1 < iVar3) {
      return iVar3;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  this->errno_ = *piVar2;
  return iVar3;
}

Assistant:

int FileInputStream::CopyingFileInputStream::Read(void* buffer, int size) {
  ABSL_CHECK(!is_closed_);

  int result;
  do {
    result = read(file_, buffer, size);
  } while (result < 0 && errno == EINTR);

  if (result < 0) {
    // Read error (not EOF).
    errno_ = errno;
  }

  return result;
}